

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O0

void __thiscall Database::load_iterator(Database *this,DatabaseName *name)

{
  string_view_t fmt;
  char *s;
  OnDiskIterator *__args_1;
  undefined1 uVar1;
  DatabaseName *in_RSI;
  long in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>,_bool>
  pVar2;
  DatabaseName *in_stack_00000228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  undefined7 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe57;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170 [11];
  DatabaseName *local_10;
  
  s = (char *)(in_RDI + 0x80);
  local_10 = in_RSI;
  __args_1 = (OnDiskIterator *)DatabaseName::get_id_abi_cxx11_(in_RSI);
  __args = local_170;
  OnDiskIterator::load(in_stack_00000228);
  pVar2 = std::
          map<std::__cxx11::string,OnDiskIterator,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OnDiskIterator>>>
          ::emplace<std::__cxx11::string_const&,OnDiskIterator>
                    ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>_>
                      *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),__args,
                     __args_1);
  uVar1 = pVar2.second;
  OnDiskIterator::~OnDiskIterator(__args_1);
  ::fmt::v6::basic_string_view<char>::basic_string_view((basic_string_view<char> *)__args_1,s);
  DatabaseName::get_filename_abi_cxx11_(local_10);
  fmt.size_._0_7_ = in_stack_fffffffffffffe50;
  fmt.data_ = (char *)__args;
  fmt.size_._7_1_ = uVar1;
  spdlog::info<std::__cxx11::string>
            (fmt,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args_1);
  return;
}

Assistant:

void Database::load_iterator(const DatabaseName &name) {
    iterators.emplace(name.get_id(), OnDiskIterator::load(name));
    spdlog::info("LOAD: {}", name.get_filename());
}